

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O2

void __thiscall VcprojGenerator::initManifestTool(VcprojGenerator *this)

{
  QMakeProject *pQVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  long in_FS_OFFSET;
  ProString tmplt;
  QArrayDataPointer<char16_t> QStack_c8;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char16_t> local_98 [2];
  ProString local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.m_file = -0x55555556;
  local_68._36_4_ = 0xaaaaaaaa;
  local_68.m_hash = 0xaaaaaaaaaaaaaaaa;
  local_68.m_string.d.size = -0x5555555555555556;
  local_68.m_offset = -0x55555556;
  local_68.m_length = -0x55555556;
  local_68.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_68.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)local_98,"TEMPLATE");
  QMakeEvaluator::first(&local_68,&pQVar1->super_QMakeEvaluator,(ProKey *)local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_98);
  bVar4 = ProString::operator==(&local_68,"vclib");
  if (bVar4) {
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    QString::QString((QString *)local_98,"embed_manifest_dll");
    bVar2 = false;
    bVar5 = QMakeProject::isActiveConfig(pQVar1,(QString *)local_98,false);
    if (bVar5) goto LAB_001ce220;
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    QString::QString((QString *)&local_b0,"static");
    bVar5 = QMakeProject::isActiveConfig(pQVar1,(QString *)&local_b0,false);
    bVar2 = true;
    if (bVar5) goto LAB_001ce220;
  }
  else {
    bVar2 = false;
LAB_001ce220:
    bVar5 = ProString::operator==(&local_68,"vcapp");
    if (bVar5) {
      pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      QString::QString((QString *)&QStack_c8,"embed_manifest_exe");
      bVar5 = QMakeProject::isActiveConfig(pQVar1,(QString *)&QStack_c8,false);
      bVar5 = !bVar5;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_c8);
    }
    else {
      bVar5 = false;
    }
    bVar3 = !bVar2;
    bVar2 = bVar5;
    if (bVar3) goto LAB_001ce289;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
  bVar5 = bVar2;
LAB_001ce289:
  if (bVar4) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(local_98);
  }
  if (bVar5) {
    (this->vcProject).Configuration.manifestTool.EmbedManifest = _False;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initManifestTool()
{
    VCManifestTool &tool = vcProject.Configuration.manifestTool;
    const ProString tmplt = project->first("TEMPLATE");
    if ((tmplt == "vclib"
         && !project->isActiveConfig("embed_manifest_dll")
         && !project->isActiveConfig("static"))
        || (tmplt == "vcapp"
            && !project->isActiveConfig("embed_manifest_exe"))) {
        tool.EmbedManifest = _False;
    }
}